

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_pool_test.cc
# Opt level: O2

void __thiscall ccel_handler_pool_test::test_method(ccel_handler_pool_test *this)

{
  test_handler_class *ptVar1;
  handler_pool<test_handler_class> *this_00;
  unit_test_log_t *this_01;
  undefined1 local_2b9;
  assertion_result local_2b8;
  char *local_2a0;
  test_handler_class *a;
  begin local_290;
  lazy_ostream local_278;
  assertion_result *local_268;
  begin *local_260;
  const_string local_258;
  const_string local_248;
  const_string local_238;
  const_string local_228;
  const_string local_218;
  const_string local_208;
  handler_pool<test_handler_class> pool1;
  
  this_00 = &pool1;
  ccel::handler_pool<test_handler_class>::handler_pool(this_00,0,0);
  local_278._vptr_lazy_ostream = (_func_int **)CONCAT44(local_278._vptr_lazy_ostream._4_4_,1);
  ptVar1 = ccel::handler_pool<test_handler_class>::construct<int>(this_00,(int *)&local_278);
  local_208.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_208.m_end = "";
  local_218.m_begin = "";
  local_218.m_end = "";
  a = ptVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_208,0x11,&local_218);
  local_2b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(ptVar1 != (test_handler_class *)0x0);
  local_2b8.m_message.px = (element_type *)0x0;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
  local_260 = &local_290;
  local_290.m_file_name.m_begin = "a != nullptr";
  local_290.m_file_name.m_end = "";
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001e3428;
  local_228.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_228.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_278,&local_228,0x11,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_2b8.m_message.pn);
  local_290.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_290.m_file_name.m_end = "";
  local_290.m_line_num = 0x12;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_290);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_2b9 = true;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::instance();
  local_2b8.m_message.px = (element_type *)((ulong)local_2b8.m_message.px & 0xffffffffffffff00);
  local_2b8._0_8_ = &PTR__lazy_ostream_001e3468;
  local_2a0 = "Address of a:";
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001e34a8;
  local_260 = (begin *)&a;
  local_268 = &local_2b8;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_2b9,&local_278);
  this_01 = (unit_test_log_t *)&local_2b9;
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)this_01);
  local_238.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_238.m_end = "";
  local_248.m_begin = "";
  local_248.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(this_01,&local_238,0x13,&local_248);
  local_2b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(a->_value == 1);
  local_2b8.m_message.px = (element_type *)0x0;
  local_2b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
  local_290.m_file_name.m_begin = "a->get_value() == 1";
  local_290.m_file_name.m_end = "";
  local_278.m_empty = false;
  local_278._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001e3428;
  local_258.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_258.m_end = "";
  local_260 = &local_290;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b8,&local_278,&local_258,0x13,REQUIRE,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_2b8.m_message.pn);
  ccel::handler_pool<test_handler_class>::~handler_pool(&pool1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( ccel_handler_pool_test)
{
  ccel::handler_pool<test_handler_class> pool1;
  auto a=pool1.construct(1);
  BOOST_CHECK(a != nullptr);
  BOOST_TEST_MESSAGE("Address of a:"<<a);
  BOOST_REQUIRE(a->get_value() == 1);
}